

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_2> *in_RCX;
  Type in1;
  Vector<float,_3> res;
  Type in0;
  Vector<float,_4> local_88;
  undefined4 local_78;
  Vec4 *local_70;
  float local_68 [5];
  float local_54 [3];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  Vec4 *local_30;
  float local_28;
  float local_1c [2];
  float local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_48 = (evalCtx->coords).m_data[0];
    fStack_44 = (evalCtx->coords).m_data[1];
    fStack_40 = (evalCtx->coords).m_data[2];
    fStack_3c = (evalCtx->coords).m_data[3];
  }
  else {
    local_48 = (float)0x3fb33333;
    fStack_44 = (float)0x3e4ccccd;
    fStack_40 = (float)0xbf000000;
    fStack_3c = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_88.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_88.m_data[0] = 0.5;
    local_88.m_data[1] = 1.0;
  }
  outerProduct<float,2,4>
            ((Matrix<float,_4,_2> *)&local_30,(MatrixCaseUtils *)&local_48,&local_88,in_RCX);
  local_70 = local_30;
  local_68[0] = local_28;
  local_54[0] = local_1c[0];
  local_54[1] = local_1c[1];
  local_54[2] = local_14;
  local_88.m_data[2] = 0.0;
  local_88.m_data[3] = 0.0;
  local_78 = 0;
  lVar1 = 0;
  do {
    local_88.m_data[lVar1 + 2] = *(float *)((long)&local_70 + lVar1 * 4) + local_54[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_70 = &evalCtx->color;
  local_68[0] = 0.0;
  local_68[1] = 1.4013e-45;
  local_68[2] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_70 + lVar1 * 4)] = local_88.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}